

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIterator.cpp
# Opt level: O0

void __thiscall
OnDiskIterator::pop(OnDiskIterator *this,int count,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *out)

{
  byte bVar1;
  streamoff sVar2;
  int in_ESI;
  long in_RDI;
  string next;
  int i;
  ifstream reader;
  streamoff in_stack_fffffffffffffcf8;
  path *in_stack_fffffffffffffd00;
  path *in_stack_fffffffffffffd08;
  basic_ifstream<char,_std::char_traits<char>_> *in_stack_fffffffffffffd10;
  byte local_2d1;
  fpos local_2c0 [20];
  int local_2ac;
  string local_2a8 [16];
  DatabaseName *in_stack_fffffffffffffd68;
  int local_284;
  undefined8 local_280;
  undefined8 local_278;
  istream local_220 [532];
  int local_c;
  
  local_c = in_ESI;
  DatabaseName::get_full_path_abi_cxx11_(in_stack_fffffffffffffd68);
  std::ifstream::
  ifstream<std::experimental::filesystem::v1::__cxx11::path,std::experimental::filesystem::v1::__cxx11::path>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
             (openmode)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffd00);
  std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  std::istream::seekg(local_220,local_280,local_278);
  local_284 = 0;
  while( true ) {
    local_2d1 = 0;
    if (local_284 < local_c) {
      local_2d1 = std::ios::eof();
      local_2d1 = local_2d1 ^ 0xff;
    }
    if ((local_2d1 & 1) == 0) break;
    std::__cxx11::string::string(local_2a8);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_2a8);
    bVar1 = std::ios::eof();
    if ((bVar1 & 1) == 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->_M_pathname);
      *(long *)(in_RDI + 0x150) = *(long *)(in_RDI + 0x150) + 1;
      local_2ac = 0;
    }
    else {
      local_2ac = 2;
    }
    std::__cxx11::string::~string(local_2a8);
    if (local_2ac != 0) break;
    local_284 = local_284 + 1;
  }
  local_2c0._0_16_ = std::istream::tellg();
  sVar2 = std::fpos::operator_cast_to_long(local_2c0);
  *(streamoff *)(in_RDI + 0x148) = sVar2;
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void OnDiskIterator::pop(int count, std::vector<std::string> *out) {
    std::ifstream reader(datafile_name.get_full_path(), std::ios_base::binary);
    reader.seekg(byte_offset);

    for (int i = 0; i < count && !reader.eof(); i++) {
        std::string next;
        std::getline(reader, next);
        if (reader.eof()) {
            break;
        }
        out->emplace_back(next);
        file_offset += 1;
    }
    byte_offset = reader.tellg();
}